

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

int32_t mipsdsp_mul_q15_q15_overflowflag21(uint16_t a,uint16_t b,CPUMIPSState_conflict5 *env)

{
  byte *pbVar1;
  
  if (b == 0x8000 && a == 0x8000) {
    pbVar1 = (byte *)((long)&(env->active_tc).DSPControl + 2);
    *pbVar1 = *pbVar1 | 0x20;
    return 0x7fffffff;
  }
  return (int)(short)b * (int)(short)a * 2;
}

Assistant:

static inline int32_t mipsdsp_mul_q15_q15_overflowflag21(uint16_t a, uint16_t b,
                                                         CPUMIPSState *env)
{
    int32_t temp;

    if ((a == 0x8000) && (b == 0x8000)) {
        temp = 0x7FFFFFFF;
        set_DSPControl_overflow_flag(1, 21, env);
    } else {
        temp = ((int16_t)a * (int16_t)b) << 1;
    }

    return temp;
}